

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_operations.hpp
# Opt level: O2

rt_expression_interface<double> *
viennamath::diff_impl<viennamath::rt_expression_interface<double>>
          (rt_expression_interface<double> *param_1,
          op_rt_symbolic_integral<viennamath::rt_expression_interface<double>_> param_2,
          rt_expression_interface<double> *param_3)

{
  expression_not_differentiable_exception *this;
  allocator<char> local_39;
  string local_38;
  
  this = (expression_not_differentiable_exception *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"Cannot differentiate runtime integration (yet)!",&local_39);
  expression_not_differentiable_exception::expression_not_differentiable_exception(this,&local_38);
  __cxa_throw(this,&expression_not_differentiable_exception::typeinfo,
              expression_not_differentiable_exception::~expression_not_differentiable_exception);
}

Assistant:

InterfaceType * diff_impl(const InterfaceType * /*e*/, op_rt_symbolic_integral<InterfaceType>, const InterfaceType * /*diff_var*/)
  {
    throw expression_not_differentiable_exception("Cannot differentiate runtime integration (yet)!");
    return NULL;
  }